

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void StateParentGame(pyhanabi_state_t *state,pyhanabi_game_t *dest_game)

{
  HanabiGame *pHVar1;
  undefined8 *in_RSI;
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x13b,"void StateParentGame(pyhanabi_state_t *, pyhanabi_game_t *)");
  }
  if (*in_RDI != 0) {
    if (in_RSI != (undefined8 *)0x0) {
      pHVar1 = hanabi_learning_env::HanabiState::ParentGame((HanabiState *)*in_RDI);
      *in_RSI = pHVar1;
      return;
    }
    __assert_fail("dest_game != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x13d,"void StateParentGame(pyhanabi_state_t *, pyhanabi_game_t *)");
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x13c,"void StateParentGame(pyhanabi_state_t *, pyhanabi_game_t *)");
}

Assistant:

void StateParentGame(pyhanabi_state_t* state, pyhanabi_game_t* dest_game) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  REQUIRE(dest_game != nullptr);
  dest_game->game =
      reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
      ->ParentGame();
}